

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O2

void moveToHook(qfixed x,qfixed y,void *data)

{
  ByteStream *this;
  long in_FS_OFFSET;
  qfixed local_28;
  qfixed local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = y;
  local_20 = x;
  if (*(char *)((long)data + 8) == '\0') {
    QPdf::ByteStream::operator<<(*data,"h\n");
  }
  if (*(char *)((long)data + 0x60) == '\0') {
    QTransform::map((QTransform *)((long)data + 0x10),x,y,&local_20,&local_28);
    x = local_20;
  }
  this = *data;
  QPdf::ByteStream::operator<<(this,x);
  QPdf::ByteStream::operator<<(this,local_28);
  QPdf::ByteStream::operator<<(this,"m\n");
  *(undefined1 *)((long)data + 8) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void moveToHook(qfixed x, qfixed y, void *data)
{
    QPdf::Stroker *t = (QPdf::Stroker *)data;
    if (!t->first)
        *t->stream << "h\n";
    if (!t->cosmeticPen)
        t->matrix.map(x, y, &x, &y);
    *t->stream << x << y << "m\n";
    t->first = false;
}